

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void filter<float>(TWaveformT<float> *waveform,EAudioFilter filterId,float freqCutoff_Hz,
                  int64_t sampleRate)

{
  bool bVar1;
  reference pfVar2;
  uint in_ESI;
  undefined8 in_RDI;
  TSampleF TVar3;
  float *s_1;
  iterator __end0_1;
  iterator __begin0_1;
  TWaveformT<float> *__range3_1;
  TFilterCoefficients filterCoefficients_1;
  float *s;
  iterator __end0;
  iterator __begin0;
  TWaveformT<float> *__range3;
  TFilterCoefficients filterCoefficients;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff50;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_a8;
  undefined8 local_a0;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_58;
  undefined8 local_50;
  TFilterCoefficients local_44;
  undefined8 local_8;
  
  if (in_ESI != 0) {
    local_8 = in_RDI;
    if (in_ESI == 1) {
      calculateCoefficientsFirstOrderHighPass
                ((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(int)in_stack_ffffffffffffff50);
      local_50 = local_8;
      local_58._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin(in_stack_ffffffffffffff38);
      std::vector<float,_std::allocator<float>_>::end(in_stack_ffffffffffffff38);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)CONCAT44(in_ESI,in_stack_ffffffffffffff40),
                                (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)in_stack_ffffffffffffff38), bVar1) {
        pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator*(&local_58);
        TVar3 = filterFirstOrderHighPass(&local_44,*pfVar2);
        *pfVar2 = TVar3;
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&local_58);
      }
    }
    else if (in_ESI == 2) {
      calculateCoefficientsSecondOrderButterworthHighPass
                ((int)in_stack_ffffffffffffff74,(int)in_stack_ffffffffffffff70);
      local_a0 = local_8;
      local_a8._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin(in_stack_ffffffffffffff38);
      std::vector<float,_std::allocator<float>_>::end(in_stack_ffffffffffffff38);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)CONCAT44(in_ESI,in_stack_ffffffffffffff40),
                                (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)in_stack_ffffffffffffff38), bVar1) {
        pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator*(&local_a8);
        TVar3 = filterSecondOrderButterworthHighPass
                          ((TFilterCoefficients *)&stack0xffffffffffffff6c,*pfVar2);
        *pfVar2 = TVar3;
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&local_a8);
      }
    }
    else {
      fprintf(_stderr,"Unknown filter type: %d\n",(ulong)in_ESI);
    }
  }
  return;
}

Assistant:

void filter(TWaveformT<TSample> & waveform, EAudioFilter filterId, float freqCutoff_Hz, int64_t sampleRate) {
    switch (filterId) {
        case EAudioFilter::None:
            {
                return;
            }
            break;
        case EAudioFilter::FirstOrderHighPass:
            {
                auto filterCoefficients = ::calculateCoefficientsFirstOrderHighPass(freqCutoff_Hz, sampleRate);
                for (auto & s : waveform) {
                    s = ::filterFirstOrderHighPass(filterCoefficients, s);
                }
                return;
            }
            break;
        case EAudioFilter::SecondOrderButterworthHighPass:
            {
                auto filterCoefficients = ::calculateCoefficientsSecondOrderButterworthHighPass(freqCutoff_Hz, sampleRate);
                for (auto & s : waveform) {
                    s = ::filterSecondOrderButterworthHighPass(filterCoefficients, s);
                }
                return;
            }
            break;
    }

    fprintf(stderr, "Unknown filter type: %d\n", filterId);
}